

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::relative_pose::modules::sixpt_main
               (Matrix<double,_6,_6,_0,_6,_6> *L1,Matrix<double,_6,_6,_0,_6,_6> *L2,
               rotations_t *solutions)

{
  int r;
  long lVar1;
  int i;
  long lVar2;
  complex<double> *pcVar3;
  double *pdVar4;
  double *pdVar5;
  complex<double> *__x;
  double dVar6;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  cayley_t solution;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  Matrix<double,_64,_64,_0,_64,_64> Action;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  rotation_t *prStack_40e28;
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  _Stack_40e20;
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  _Stack_40e00;
  cayley_t cStack_40de8;
  rotation_t rStack_40dd0;
  Matrix<double,_3,_3,_0,_3,_3> MStack_40d88;
  undefined1 auStack_40d40 [24];
  undefined8 uStack_40d28;
  long lStack_40d20;
  undefined8 uStack_40d18;
  complex<double> acStack_40980 [3];
  complex<double> acStack_40950 [4033];
  Matrix<double,_64,_64,_0,_64,_64> MStack_30d40;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> EStack_28d40;
  
  dVar6 = 0.0;
  _Stack_40e00._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_40e20._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_40e00._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_40e00._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_40e20._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_40e20._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar4 = (double *)L2;
  pdVar5 = (double *)L1;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    uStack_40d28 = 0;
    uStack_40d18 = 6;
    auStack_40d40._0_8_ = pdVar5;
    auStack_40d40._16_8_ = L1;
    lStack_40d20 = lVar2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&EStack_28d40,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               auStack_40d40);
    std::
    vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
    ::emplace_back<Eigen::Matrix<double,6,1,0,6,1>>
              ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                *)&_Stack_40e00,(Matrix<double,_6,_1,_0,_6,_1> *)&EStack_28d40);
    uStack_40d28 = 0;
    uStack_40d18 = 6;
    auStack_40d40._0_8_ = pdVar4;
    auStack_40d40._16_8_ = L2;
    lStack_40d20 = lVar2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&EStack_28d40,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               auStack_40d40);
    std::
    vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
    ::emplace_back<Eigen::Matrix<double,6,1,0,6,1>>
              ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                *)&_Stack_40e20,(Matrix<double,_6,_1,_0,_6,_1> *)&EStack_28d40);
    pdVar4 = pdVar4 + 6;
    pdVar5 = pdVar5 + 6;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,64,64,0,64,64>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,64,0,64,64>>>
            ((PlainObjectBase<Eigen::Matrix<double,64,64,0,64,64>> *)&MStack_30d40,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_64,_64,_0,_64,_64>_>_>
              *)&EStack_28d40);
  sixpt::setupAction((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)&_Stack_40e00,
                     (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)&_Stack_40e20,&MStack_30d40);
  Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
  EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>
            ((EigenSolver<Eigen::Matrix<double,64,64,0,64,64>> *)&EStack_28d40,
             (EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)&MStack_30d40,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::eigenvectors
            ((EigenvectorsType *)auStack_40d40,&EStack_28d40);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::reserve(solutions,0x40);
  pcVar3 = acStack_40980;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    __x = pcVar3;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      std::operator/(__x,acStack_40950 + lVar2 * 0x40);
      cStack_40de8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[lVar1] = dVar6;
      __x = __x + 1;
    }
    math::cayley2rot(&rStack_40dd0,&cStack_40de8);
    prStack_40e28 = &rStack_40dd0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&MStack_40d88,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&prStack_40e28
              );
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::emplace_back<Eigen::Matrix<double,3,3,0,3,3>>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)solutions,&MStack_40d88);
    pcVar3 = pcVar3 + 0x40;
  }
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&_Stack_40e20);
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&_Stack_40e00);
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt_main(
  Eigen::Matrix<double,6,6> & L1,
  Eigen::Matrix<double,6,6> & L2,
  rotations_t & solutions)
{
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L1vec;
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<double,64,64> Action = Eigen::Matrix<double,64,64>::Zero();
  sixpt::setupAction( L1vec, L2vec, Action );
  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<double,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<double>,64,64> EV = Eig.eigenvectors();
  
  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    cayley_t solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<double> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real();
    }
    
    solutions.push_back(math::cayley2rot(solution).transpose());
  }
}